

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber
doRangeTestFixSize(RangeTestFunction testFunction,void *opaqueData,TA_Integer refOutBeg,
                  TA_Integer refOutNbElement,TA_Integer refLookback,TA_Real *refBuffer,
                  TA_Integer *refBufferInt,TA_FuncUnstId unstId,TA_Integer fixSize,uint outputNb,
                  uint integerTolerance)

{
  double dVar1;
  double dVar2;
  TA_FuncUnstId integerTolerance_00;
  TA_RetCode TVar3;
  int iVar4;
  double *__ptr;
  uint in_ECX;
  TA_FuncUnstId in_EDX;
  undefined8 in_RSI;
  uint *in_RDI;
  undefined4 in_R8D;
  TA_Integer *in_R9;
  long in_stack_00000008;
  uint in_stack_00000018;
  undefined4 in_stack_00000020;
  uint outputIsInteger;
  TA_Integer *outputBufferInt;
  TA_Integer outputSizeByOptimalLogic;
  TA_Integer relativeIdx;
  TA_Integer endIdx;
  TA_Integer startIdx;
  TA_Integer lookback;
  TA_Integer outputNbElement;
  TA_Integer outputBegIdx;
  TA_Integer temp;
  TA_Integer i;
  TA_Real val2;
  TA_Real val1;
  TA_Real *outputBuffer;
  TA_RetCode retCode;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined4 uVar7;
  int *piVar8;
  TA_FuncUnstId local_98;
  int local_94;
  uint *local_90;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  TA_FuncUnstId unstId_00;
  TA_FuncUnstId in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  TA_FuncUnstId in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  int iVar9;
  uint uVar10;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 uVar11;
  ErrorNumber local_14;
  
  __ptr = (double *)malloc((long)(int)(in_stack_00000018 + 2) << 3);
  if (__ptr == (double *)0x0) {
    local_14 = TA_TESTUTIL_DRT_ALLOC_ERR;
  }
  else {
    local_90 = (uint *)malloc((long)(int)(in_stack_00000018 + 2) << 2);
    if (in_stack_00000008 == 0) {
      free(__ptr);
      local_14 = TA_TESTUTIL_DRT_ALLOC_ERR;
    }
    else {
      *__ptr = 9.1349043e-200;
      __ptr[(int)(in_stack_00000018 + 1)] = 8.1489031e-158;
      *local_90 = 0x80000000;
      local_90[(int)(in_stack_00000018 + 1)] = 0x80000000;
      for (iVar9 = 1; iVar9 <= (int)in_stack_00000018; iVar9 = iVar9 + 1) {
        __ptr[iVar9] = -2.849284e-199;
        local_90[iVar9] = 0x80000000;
      }
      for (unstId_00 = TA_FUNC_UNST_ADX; unstId_00 <= 0xfc - in_stack_00000018;
          unstId_00 = unstId_00 + TA_FUNC_UNST_ADXR) {
        integerTolerance_00 = unstId_00 + in_stack_00000018 + TA_FUNC_UNST_NONE;
        puVar5 = &stack0xffffffffffffff90;
        puVar6 = &stack0xffffffffffffff8c;
        piVar8 = &local_94;
        uVar7 = in_stack_00000020;
        uVar11 = in_RSI;
        TVar3 = CallTestFunction((RangeTestFunction)CONCAT44(iVar9,in_stack_ffffffffffffff98),
                                 in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                                 (TA_Real *)CONCAT44(in_stack_ffffffffffffff8c,unstId_00),
                                 (TA_Integer *)
                                 CONCAT44(integerTolerance_00,in_stack_ffffffffffffff80),
                                 (TA_Integer *)
                                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_R9
                                 ,(TA_Integer *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),
                                 (void *)CONCAT44(in_EDX,in_ECX),(uint)in_RSI,in_RDI);
        if (TVar3 != TA_SUCCESS) {
          printf("Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n",(ulong)TVar3,
                 (ulong)in_stack_00000018,(ulong)(uint)unstId_00);
          free(__ptr);
          free(local_90);
          return TA_TESTUTIL_DRT_RETCODE_ERR;
        }
        if (in_stack_ffffffffffffff90 == 0) {
          if ((in_stack_ffffffffffffff8c < unstId_00) ||
             (in_stack_ffffffffffffff8c < integerTolerance_00)) {
            printf("Fail: doRangeTestFixSize data missing (%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff8c);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_MISSING_DATA;
          }
        }
        else {
          if (((in_stack_ffffffffffffff94 < unstId_00) ||
              (integerTolerance_00 < in_stack_ffffffffffffff94)) ||
             (in_stack_ffffffffffffff94 < in_EDX)) {
            printf("Fail: doRangeTestFixSize bad outBegIdx\n");
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
          }
          if (((int)in_stack_00000018 < (int)in_stack_ffffffffffffff90) ||
             ((int)in_ECX < (int)in_stack_ffffffffffffff90)) {
            printf("Fail: doRangeTestFixSize Incorrect outputNbElement\n");
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
          }
          if (in_stack_ffffffffffffff94 < in_stack_ffffffffffffff8c) {
            printf("Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n",
                   (ulong)(uint)in_stack_ffffffffffffff8c);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
          }
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff94 - in_EDX;
          for (uVar10 = 0; (int)uVar10 < (int)in_stack_ffffffffffffff90; uVar10 = uVar10 + 1) {
            if (local_94 == 0) {
              dVar1 = __ptr[(int)(uVar10 + 1)];
              dVar2 = *(double *)(in_R9 + (long)(int)(in_stack_ffffffffffffff80 + uVar10) * 2);
              iVar9 = dataWithinReasonableRange
                                ((TA_Real)CONCAT44(uVar10,in_stack_ffffffffffffff98),
                                 (TA_Real)CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff8c,unstId_00,integerTolerance_00);
              if (iVar9 == 0) {
                printf("Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n",dVar1,(ulong)uVar10
                      );
                printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                       (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                       (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,
                       in_RSI,uVar7,piVar8);
                printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                       (ulong)(uint)in_EDX,(ulong)in_ECX);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  printf("Fail: Diff %g %%\n",((dVar2 - dVar1) / dVar1) * 100.0);
                }
                free(__ptr);
                free(local_90);
                return TA_TESTUTIL_DRT_DATA_DIFF;
              }
            }
            else if (local_90[(int)(uVar10 + 1)] !=
                     *(uint *)(in_stack_00000008 +
                              (long)(int)(in_stack_ffffffffffffff80 + uVar10) * 4)) {
              printf("Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n",(ulong)uVar10,
                     (ulong)local_90[(int)(uVar10 + 1)],
                     (ulong)*(uint *)(in_stack_00000008 +
                                     (long)(int)(in_stack_ffffffffffffff80 + uVar10) * 4));
              printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                     (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                     (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                     uVar7,piVar8);
              printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                     (ulong)(uint)in_EDX,(ulong)in_ECX);
              free(__ptr);
              free(local_90);
              return TA_TESTUTIL_DRT_DATA_DIFF_INT;
            }
            if (((0x1e < (int)in_stack_ffffffffffffff90) &&
                (in_stack_ffffffffffffff98 = in_stack_ffffffffffffff90 - 0x14, 0x14 < (int)uVar10))
               && ((int)uVar10 < (int)in_stack_ffffffffffffff98)) {
              iVar9 = rand();
              uVar10 = iVar9 % 200 + uVar10;
              if ((int)in_stack_ffffffffffffff98 < (int)uVar10) {
                uVar10 = in_stack_ffffffffffffff98;
              }
            }
          }
          local_98 = unstId_00;
          if (unstId_00 < in_stack_ffffffffffffff8c) {
            local_98 = in_stack_ffffffffffffff8c;
          }
          if (integerTolerance_00 < local_98) {
            in_stack_ffffffffffffff7c = 0;
          }
          else {
            in_stack_ffffffffffffff7c = (integerTolerance_00 - local_98) + 1;
          }
          if ((in_stack_00000018 != in_stack_ffffffffffffff90) &&
             ((__ptr[in_stack_ffffffffffffff7c + 1] != -2.849284e-199 ||
              (NAN(__ptr[in_stack_ffffffffffffff7c + 1]))))) {
            printf("Fail: doRangeTestFixSize out-of-bound output (%e)\n",
                   __ptr[in_stack_ffffffffffffff7c + 1]);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
          }
          if ((in_stack_00000018 != in_stack_ffffffffffffff90) &&
             (local_90[in_stack_ffffffffffffff7c + 1] != 0x80000000)) {
            printf("Fail: doRangeTestFixSize out-of-bound output  (%d)\n",
                   (ulong)local_90[in_stack_ffffffffffffff7c + 1]);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
          }
          if ((*__ptr != 9.1349043e-200) || (NAN(*__ptr))) {
            printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n",*__ptr);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_BAD_PREFIX;
          }
          if (*local_90 != 0x80000000) {
            printf("Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n",(ulong)*local_90);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_BAD_PREFIX;
          }
          if ((__ptr[(int)(in_stack_00000018 + 1)] != 8.1489031e-158) ||
             (NAN(__ptr[(int)(in_stack_00000018 + 1)]))) {
            printf("Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX (%e)\n",
                   __ptr[(int)(in_stack_00000018 + 1)]);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_BAD_SUFFIX;
          }
          if (local_90[(int)(in_stack_00000018 + 1)] != 0x80000000) {
            printf("Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX_INT (%d)\n",
                   (ulong)local_90[(int)(in_stack_00000018 + 1)]);
            printf("Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n",(ulong)(uint)unstId_00,
                   (ulong)(uint)integerTolerance_00,(ulong)(uint)in_stack_ffffffffffffff94,
                   (ulong)in_stack_ffffffffffffff90,(ulong)in_stack_00000018,puVar5,puVar6,in_RSI,
                   uVar7,piVar8);
            printf("Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n",
                   (ulong)(uint)in_EDX,(ulong)in_ECX);
            free(__ptr);
            free(local_90);
            return TA_TESTUTIL_DRT_BAD_SUFFIX;
          }
          if (local_94 == 0) {
            for (iVar9 = 1; iVar9 <= (int)in_stack_00000018; iVar9 = iVar9 + 1) {
              __ptr[iVar9] = -2.849284e-199;
            }
          }
          else {
            for (iVar9 = 1; iVar9 <= (int)in_stack_00000018; iVar9 = iVar9 + 1) {
              local_90[iVar9] = 0x80000000;
            }
          }
        }
        if (((TA_FUNC_UNST_ALL|TA_FUNC_UNST_HT_DCPERIOD) < unstId_00) &&
           (unstId_00 + 100 <= (int)(0xfc - in_stack_00000018))) {
          iVar4 = rand();
          in_stack_ffffffffffffff98 = iVar4 % 100 + 0x28;
          unstId_00 = in_stack_ffffffffffffff98 + unstId_00;
        }
        in_RSI = uVar11;
      }
      free(__ptr);
      free(local_90);
      local_14 = TA_TEST_PASS;
    }
  }
  return local_14;
}

Assistant:

static ErrorNumber doRangeTestFixSize( RangeTestFunction testFunction,
                                       void *opaqueData,
                                       TA_Integer refOutBeg,
                                       TA_Integer refOutNbElement,
                                       TA_Integer refLookback,
                                       const TA_Real *refBuffer,
                                       const TA_Integer *refBufferInt,
                                       TA_FuncUnstId unstId,
                                       TA_Integer fixSize,
                                       unsigned int outputNb,
                                       unsigned int integerTolerance )
{
   TA_RetCode retCode;
   TA_Real *outputBuffer;
   TA_Real val1, val2;
   TA_Integer i, temp;
   TA_Integer outputBegIdx, outputNbElement, lookback;
   TA_Integer startIdx, endIdx, relativeIdx, outputSizeByOptimalLogic;
   TA_Integer *outputBufferInt;
   unsigned int outputIsInteger;

   (void)refLookback;

   /* Allocate the output buffer (+prefix and suffix memory guard). */
   outputBuffer = (TA_Real *)TA_Malloc( (fixSize+2) * sizeof( TA_Real ) );

   if( !outputBuffer )
      return TA_TESTUTIL_DRT_ALLOC_ERR;

   outputBufferInt = (TA_Integer *)TA_Malloc( (fixSize+2) * sizeof( TA_Integer ) );

   if( !refBufferInt )
   {
      TA_Free( outputBuffer );
      return TA_TESTUTIL_DRT_ALLOC_ERR;
   }

   outputBuffer[0] = RESV_PATTERN_PREFIX;
   outputBuffer[fixSize+1] = RESV_PATTERN_SUFFIX;

   outputBufferInt[0] = RESV_PATTERN_PREFIX_INT;
   outputBufferInt[fixSize+1] = RESV_PATTERN_SUFFIX_INT;

   /* Initialize the outputs with improbable values. */
   for( i=1; i <= fixSize; i++ )
   {
      outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
      outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
   }

   /* Test for a large number of possible startIdx */
   for( startIdx=0; startIdx <= (MAX_RANGE_SIZE-fixSize); startIdx++ )
   {
      /* Call the TA function. */
      endIdx = startIdx+fixSize-1;
      retCode = CallTestFunction( testFunction, startIdx, endIdx,
                              &outputBuffer[1], &outputBufferInt[1],
                              &outputBegIdx, &outputNbElement, &lookback,
                              opaqueData, outputNb, &outputIsInteger );

      if( retCode != TA_SUCCESS )
      {
          /* No call shall never fail here. When the range
           * is "out-of-range" the function shall still return
           * TA_SUCCESS with the outNbElement equal to zero.
           */
         printf( "Fail: doRangeTestFixSize testFunction return error=(%d) (%d,%d)\n", retCode, fixSize, startIdx );
         TA_Free( outputBuffer );
         TA_Free( outputBufferInt );
         return TA_TESTUTIL_DRT_RETCODE_ERR;
      }
      else
      {
         /* Possible startIdx gap of the output shall be always the
          * same regardless of the range.
          */
         if( outputNbElement == 0 )
         {
            /* Trap cases where there is no output. */
            if( (startIdx > lookback) || (endIdx > lookback) )
            {
               /* Whenever startIdx is greater than lookback, some data
                * shall be return. Same idea with endIdx.
                *
                * Note:
                *  some output will never start at the startIdx, particularly
                *  when a TA function have multiple output. Usually, the first output
                *  will be between startIdx/endIdx and other outputs may have a "gap"
                *  from the startIdx.
                *
                * Example:
                *    Stochastic %K is between startIdx/endIdx, but %D output will
                *    have less data because it is a MA of %K. A gap will then
                *    exist for the %D output.
                */
               printf( "Fail: doRangeTestFixSize data missing (%d,%d,%d)\n", startIdx, endIdx, lookback );

               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_MISSING_DATA;
            }
         }
         else
         {
            /* Some output was returned. Are the returned index correct? */
            if( (outputBegIdx < startIdx) || (outputBegIdx > endIdx) || (outputBegIdx < refOutBeg))
            {
               printf( "Fail: doRangeTestFixSize bad outBegIdx\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_OUTBEGIDX;
            }

            if( (outputNbElement > fixSize) || (outputNbElement > refOutNbElement) )
            {
               printf( "Fail: doRangeTestFixSize Incorrect outputNbElement\n" );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free(  outputBuffer );
               return TA_TESTUTIL_DRT_BAD_OUTNBLEMENT;
            }

            /* Is the calculated lookback too high? */
            if( outputBegIdx < lookback )
            {
               printf( "Fail: doRangeTestFixSize Lookback calculation too high? (%d)\n", lookback );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_LOOKBACK_TOO_HIGH;
            }

            /* Is the output identical to the reference? */
            relativeIdx = outputBegIdx-refOutBeg;
            for( i=0; i < outputNbElement; i++ )
            {
               if( outputIsInteger )
               {
                  if( outputBufferInt[1+i] != refBufferInt[relativeIdx+i] )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%d,%d)\n", i,
                              outputBufferInt[1+i], refBufferInt[relativeIdx+i] );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF_INT;
                  }
               }
               else
               {
                  val1 = outputBuffer[1+i];
                  val2 = refBuffer[relativeIdx+i];
                  if( !dataWithinReasonableRange( val1, val2, i, unstId, integerTolerance ) )
                  {
                     printf( "Fail: doRangeTestFixSize diff data for idx=%d (%e,%e)\n", i, val1, val2 );
                     printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
                     printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
                     if( val1 != 0.0 )
                        printf( "Fail: Diff %g %%\n", ((val2-val1)/val1)*100.0 );
                     TA_Free( outputBuffer );
                     TA_Free( outputBufferInt );
                     return TA_TESTUTIL_DRT_DATA_DIFF;
                  }
               }

               /* Randomly skip the verification of some value. Limit
                * cases are always checked though.
                */
               if( outputNbElement > 30 )
               {
                  temp = outputNbElement-20;
                  if( (i > 20) && (i < temp) )
                  {
                     /* Randomly skips from 0 to 200 verification.
                      * Never make it skip the last 20 values.
                      */
                     i += (rand() % 200);
                     if( i > temp )
                        i = temp;
                  }
               }
            }

            /* Verify out-of-bound writing in the output buffer. */
            outputSizeByOptimalLogic = max(lookback,startIdx);
            if( outputSizeByOptimalLogic > endIdx )
               outputSizeByOptimalLogic = 0;
            else
               outputSizeByOptimalLogic = endIdx-outputSizeByOptimalLogic+1;

            if( (fixSize != outputNbElement) && (outputBuffer[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output (%e)\n", outputBuffer[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT;
            }

            if( (fixSize != outputNbElement) && (outputBufferInt[1+outputSizeByOptimalLogic] != RESV_PATTERN_IMPROBABLE_INT) )
            {
               printf( "Fail: doRangeTestFixSize out-of-bound output  (%d)\n", outputBufferInt[1+outputSizeByOptimalLogic] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_OUT_OF_BOUND_OUT_INT;
            }

            /* Verify that the memory guard were preserved. */
            if( outputBuffer[0] != RESV_PATTERN_PREFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX (%e)\n", outputBuffer[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBufferInt[0] != RESV_PATTERN_PREFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_PREFIX_INT (%d)\n", outputBufferInt[0] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_PREFIX;
            }

            if( outputBuffer[fixSize+1] != RESV_PATTERN_SUFFIX )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX (%e)\n", outputBuffer[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            if( outputBufferInt[fixSize+1] != RESV_PATTERN_SUFFIX_INT )
            {
               printf( "Fail: doRangeTestFixSize bad RESV_PATTERN_SUFFIX_INT (%d)\n", outputBufferInt[fixSize+1] );
               printf( "Fail: doRangeTestFixSize (%d,%d,%d,%d,%d)\n", startIdx, endIdx, outputBegIdx, outputNbElement, fixSize );
               printf( "Fail: doRangeTestFixSize refOutBeg,refOutNbElement (%d,%d)\n", refOutBeg, refOutNbElement );
               TA_Free( outputBuffer );
               TA_Free( outputBufferInt );
               return TA_TESTUTIL_DRT_BAD_SUFFIX;
            }

            /* Clean-up for next test. */
            if( outputIsInteger )
            {
               for( i=1; i <= fixSize; i++ )
                  outputBufferInt[i] = RESV_PATTERN_IMPROBABLE_INT;
            }
            else
            {
               for( i=1; i <= fixSize; i++ )
                  outputBuffer[i] = RESV_PATTERN_IMPROBABLE;
            }
         }

         /* Skip some startIdx at random. Limit case are still
          * tested though.
          */
         if( (startIdx > 30) && ((startIdx+100) <= (MAX_RANGE_SIZE-fixSize)) )
         {
            /* Randomly skips from 40 to 100 tests. */
            temp = (rand() % 100)+40;
            startIdx += temp;
         }
      }

      /* Loop and move forward for the next startIdx to test. */
   }

   TA_Free( outputBuffer );
   TA_Free( outputBufferInt );
   return TA_TEST_PASS;
}